

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::substring::
     merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                *stack,char *T,iterator PA,iterator first,iterator middle,iterator last,iterator buf
               ,value_type bufsize,value_type depth)

{
  iterator c;
  iterator first2;
  iterator last1;
  iterator first1;
  iterator p2;
  iterator p2_00;
  iterator p2_01;
  iterator p2_02;
  iterator p2_03;
  iterator p2_04;
  iterator p2_05;
  iterator p2_06;
  iterator p1;
  iterator p1_00;
  iterator p1_01;
  iterator p1_02;
  iterator p1_03;
  iterator p1_04;
  iterator p1_05;
  iterator p1_06;
  iterator a;
  iterator PA_00;
  iterator a_00;
  iterator buf_00;
  iterator PA_01;
  iterator c_00;
  pos_type pVar1;
  bool bVar2;
  int iVar3;
  difference_type dVar4;
  long lVar5;
  reference pvVar6;
  ulong uVar7;
  ulong *puVar8;
  iterator *it;
  difference_type dVar9;
  undefined8 in_RCX;
  undefined8 in_RDX;
  pos_type in_RSI;
  value_type *in_R8;
  BitmapArray<long> *in_R9;
  reference rVar10;
  iterator iVar11;
  BitmapArray<long> *in_stack_00000008;
  value_type *in_stack_00000018;
  BitmapArray<long> *in_stack_00000020;
  long in_stack_00000038;
  stackinfo_type tempinfo_2;
  stackinfo_type tempinfo_1;
  stackinfo_type tempinfo;
  int next;
  int check;
  difference_type half;
  difference_type len;
  difference_type m;
  iterator j;
  iterator i;
  value_type *in_stack_fffffffffffff478;
  BitmapArray<long> *in_stack_fffffffffffff480;
  BitmapArray<long> *in_stack_fffffffffffff488;
  value_type *in_stack_fffffffffffff498;
  BitmapArray<long> *in_stack_fffffffffffff4a0;
  BitmapArray<long> *in_stack_fffffffffffff4a8;
  ulong in_stack_fffffffffffff4b0;
  BitmapArray<long> *in_stack_fffffffffffff4b8;
  pos_type in_stack_fffffffffffff4c0;
  ulong in_stack_fffffffffffff528;
  char *in_stack_fffffffffffff530;
  BitmapArray<long> *in_stack_fffffffffffff538;
  pos_type in_stack_fffffffffffff540;
  BitmapArray<long> *in_stack_fffffffffffff548;
  pos_type in_stack_fffffffffffff550;
  iterator local_a20;
  iterator iStack_a10;
  iterator iStack_a00;
  uint local_9f0;
  reference local_9e8;
  reference local_9d8;
  reference local_9c8;
  iterator local_9b8;
  iterator local_9a8;
  reference local_998;
  iterator local_988;
  reference local_978;
  iterator local_968;
  reference local_958;
  iterator local_948;
  reference local_938;
  reference local_928;
  reference local_918;
  reference local_908;
  iterator local_8f8;
  iterator local_8e8;
  reference local_8d8;
  iterator local_8c8;
  reference local_8b8;
  iterator local_8a8;
  reference local_898;
  iterator local_888;
  reference local_878;
  reference local_868;
  reference local_858;
  reference local_848;
  iterator local_838;
  iterator local_828;
  reference local_818;
  iterator local_808;
  reference local_7f8;
  iterator local_7e8;
  reference local_7d8;
  iterator local_7c8;
  reference local_7b8;
  value_type *local_7a8;
  BitmapArray<long> *local_7a0;
  iterator local_798;
  value_type *local_788;
  BitmapArray<long> *local_780;
  value_type in_stack_fffffffffffff8b8;
  value_type *in_stack_fffffffffffff8c0;
  BitmapArray<long> *in_stack_fffffffffffff8c8;
  BitmapArray<long> *in_stack_fffffffffffff8d0;
  BitmapArray<long> *in_stack_fffffffffffff8d8;
  BitmapArray<long> *in_stack_fffffffffffff8e0;
  iterator in_stack_fffffffffffff8f0;
  iterator in_stack_fffffffffffff900;
  iterator in_stack_fffffffffffff910;
  iterator local_648 [3];
  iterator local_618;
  iterator local_608;
  iterator local_5f8;
  iterator local_5e8;
  reference local_5d8;
  iterator local_5c8;
  iterator local_5b8;
  iterator local_5a8;
  reference local_598;
  iterator local_588;
  iterator local_578;
  iterator local_568;
  reference local_558;
  iterator local_548;
  iterator local_538;
  iterator local_528;
  reference local_518;
  iterator local_508;
  iterator local_4f8;
  reference local_4e8;
  iterator local_4d8;
  iterator local_4c8;
  reference local_4b8;
  iterator local_4a8;
  difference_type local_498;
  difference_type local_490;
  iterator local_488;
  iterator iStack_478;
  iterator iStack_468;
  uint local_458;
  reference local_450;
  reference local_440;
  reference local_430;
  iterator local_420;
  iterator local_410;
  reference local_400;
  iterator local_3f0;
  reference local_3e0;
  iterator local_3d0;
  reference local_3c0;
  iterator in_stack_fffffffffffffc50;
  BitmapArray<long> *in_stack_fffffffffffffc60;
  BitmapArray<long> *in_stack_fffffffffffffc68;
  BitmapArray<long> *in_stack_fffffffffffffc70;
  BitmapArray<long> *in_stack_fffffffffffffc78;
  BitmapArray<long> *in_stack_fffffffffffffc80;
  reference in_stack_fffffffffffffc90;
  iterator in_stack_fffffffffffffca0;
  iterator in_stack_fffffffffffffcb0;
  iterator local_280;
  iterator iStack_270;
  iterator iStack_260;
  uint local_250;
  reference local_248;
  reference local_238;
  reference local_228;
  iterator local_218;
  iterator local_208;
  reference local_1f8;
  iterator local_1e8;
  reference local_1d8;
  iterator local_1c8;
  reference local_1b8;
  iterator local_1a8;
  reference local_198;
  reference local_188;
  reference local_178;
  reference local_168;
  iterator local_158;
  iterator local_148;
  reference local_138;
  iterator local_128;
  reference local_118;
  iterator local_108;
  reference local_f8;
  iterator local_e8;
  reference local_d8;
  value_type *local_a8;
  BitmapArray<long> *local_a0;
  undefined8 local_88;
  undefined8 local_80;
  uint local_78;
  uint local_74;
  ulong local_70;
  ulong local_68;
  long local_60;
  iterator local_58;
  iterator local_48;
  pos_type local_38;
  iterator local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  local_38 = in_RSI;
  local_28.array_ = (BitmapArray<long> *)in_R8;
  local_28.pos_ = (pos_type)in_R9;
  local_18 = in_RDX;
  local_10 = in_RCX;
  bitmap::BitmapArray<long>::iterator::iterator(&local_48);
  bitmap::BitmapArray<long>::iterator::iterator(&local_58);
  local_74 = 0;
  while( true ) {
    while (dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                             ((iterator *)&stack0x00000018,(iterator *)&stack0x00000008),
          in_stack_00000038 < dVar4) {
      dVar4 = bitmap::BitmapArray<long>::iterator::operator-((iterator *)&stack0x00000008,&local_28)
      ;
      if (in_stack_00000038 < dVar4) {
        local_60 = 0;
        local_490 = bitmap::BitmapArray<long>::iterator::operator-
                              ((iterator *)&stack0x00000008,&local_28);
        local_498 = bitmap::BitmapArray<long>::iterator::operator-
                              ((iterator *)&stack0x00000018,(iterator *)&stack0x00000008);
        puVar8 = (ulong *)std::min<long>(&local_490,&local_498);
        local_68 = *puVar8;
        while (local_70 = (long)local_68 >> 1, 0 < (long)local_68) {
          in_stack_fffffffffffff540 = local_38;
          local_4d8 = bitmap::BitmapArray<long>::iterator::operator+
                                ((iterator *)in_stack_fffffffffffff488,
                                 (difference_type)in_stack_fffffffffffff480);
          local_4c8 = bitmap::BitmapArray<long>::iterator::operator+
                                ((iterator *)in_stack_fffffffffffff488,
                                 (difference_type)in_stack_fffffffffffff480);
          local_4b8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1167e7);
          lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x116804);
          if (lVar5 < 0) {
            local_538 = bitmap::BitmapArray<long>::iterator::operator+
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_528 = bitmap::BitmapArray<long>::iterator::operator+
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_518 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1168ea);
            uVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x116907);
            in_stack_fffffffffffff538 = (BitmapArray<long> *)(uVar7 ^ 0xffffffffffffffff);
          }
          else {
            local_508 = bitmap::BitmapArray<long>::iterator::operator+
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_4f8 = bitmap::BitmapArray<long>::iterator::operator+
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_4e8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116869);
            in_stack_fffffffffffff538 =
                 (BitmapArray<long> *)
                 bitmap::BitmapArray::value_reference::operator_cast_to_long
                           ((value_reference *)0x116886);
          }
          local_4a8 = bitmap::BitmapArray<long>::iterator::operator+
                                ((iterator *)in_stack_fffffffffffff488,
                                 (difference_type)in_stack_fffffffffffff480);
          local_588 = bitmap::BitmapArray<long>::iterator::operator-
                                ((iterator *)in_stack_fffffffffffff488,
                                 (difference_type)in_stack_fffffffffffff480);
          local_578 = bitmap::BitmapArray<long>::iterator::operator-
                                ((iterator *)in_stack_fffffffffffff488,
                                 (difference_type)in_stack_fffffffffffff480);
          local_568 = bitmap::BitmapArray<long>::iterator::operator-
                                ((iterator *)in_stack_fffffffffffff488,
                                 (difference_type)in_stack_fffffffffffff480);
          local_558 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1169b1);
          lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x1169ce);
          if (lVar5 < 0) {
            local_608 = bitmap::BitmapArray<long>::iterator::operator-
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_5f8 = bitmap::BitmapArray<long>::iterator::operator-
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_5e8 = bitmap::BitmapArray<long>::iterator::operator-
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_5d8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116af8);
            uVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x116b15);
            in_stack_fffffffffffff530 = (char *)(uVar7 ^ 0xffffffffffffffff);
          }
          else {
            local_5c8 = bitmap::BitmapArray<long>::iterator::operator-
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_5b8 = bitmap::BitmapArray<long>::iterator::operator-
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_5a8 = bitmap::BitmapArray<long>::iterator::operator-
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_598 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116a55);
            in_stack_fffffffffffff530 =
                 (char *)bitmap::BitmapArray::value_reference::operator_cast_to_long
                                   ((value_reference *)0x116a72);
          }
          local_548 = bitmap::BitmapArray<long>::iterator::operator+
                                ((iterator *)in_stack_fffffffffffff488,
                                 (difference_type)in_stack_fffffffffffff480);
          p1_03.pos_ = in_stack_fffffffffffff550;
          p1_03.array_ = in_stack_fffffffffffff548;
          p2_03.pos_ = in_stack_fffffffffffff540;
          p2_03.array_ = in_stack_fffffffffffff538;
          iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>
                            (in_stack_fffffffffffff530,p1_03,p2_03,in_stack_fffffffffffff528);
          if (iVar3 < 0) {
            local_60 = local_70 + 1 + local_60;
            local_70 = local_70 - ((local_68 & 1) == 0);
          }
          local_68 = local_70;
        }
        if (local_60 < 1) {
          if ((local_74 & 1) != 0) {
            local_7b8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1171e4);
            lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x117201);
            bVar2 = false;
            if (-1 < lVar5) {
              local_7e8 = bitmap::BitmapArray<long>::iterator::operator-
                                    ((iterator *)in_stack_fffffffffffff488,
                                     (difference_type)in_stack_fffffffffffff480);
              local_7d8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x117257);
              lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                ((value_reference *)0x117274);
              if (lVar5 < 0) {
                local_828 = bitmap::BitmapArray<long>::iterator::operator-
                                      ((iterator *)in_stack_fffffffffffff488,
                                       (difference_type)in_stack_fffffffffffff480);
                local_818 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x117303);
                bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x117320);
              }
              else {
                local_808 = bitmap::BitmapArray<long>::iterator::operator-
                                      ((iterator *)in_stack_fffffffffffff488,
                                       (difference_type)in_stack_fffffffffffff480);
                local_7f8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1172ad);
                bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x1172ca);
              }
              local_7c8 = bitmap::BitmapArray<long>::iterator::operator+
                                    ((iterator *)in_stack_fffffffffffff488,
                                     (difference_type)in_stack_fffffffffffff480);
              local_848 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11735e);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x11737b);
              local_838 = bitmap::BitmapArray<long>::iterator::operator+
                                    ((iterator *)in_stack_fffffffffffff488,
                                     (difference_type)in_stack_fffffffffffff480);
              p1_04.pos_ = in_stack_fffffffffffff550;
              p1_04.array_ = in_stack_fffffffffffff548;
              p2_04.pos_ = in_stack_fffffffffffff540;
              p2_04.array_ = in_stack_fffffffffffff538;
              iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>
                                (in_stack_fffffffffffff530,p1_04,p2_04,in_stack_fffffffffffff528);
              bVar2 = iVar3 == 0;
            }
            if (bVar2) {
              local_858 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1173f7);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x117414);
              local_868 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11742a);
              bitmap::BitmapArray<long>::value_reference::operator=
                        ((value_reference *)in_stack_fffffffffffff480,
                         (long)in_stack_fffffffffffff478);
            }
          }
          local_878 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11745b);
          lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x117478);
          bVar2 = false;
          if (-1 < lVar5) {
            local_8a8 = bitmap::BitmapArray<long>::iterator::operator-
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_898 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1174c8);
            lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x1174e5);
            if (lVar5 < 0) {
              local_8e8 = bitmap::BitmapArray<long>::iterator::operator-
                                    ((iterator *)in_stack_fffffffffffff488,
                                     (difference_type)in_stack_fffffffffffff480);
              local_8d8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x117571);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x11758e);
            }
            else {
              local_8c8 = bitmap::BitmapArray<long>::iterator::operator-
                                    ((iterator *)in_stack_fffffffffffff488,
                                     (difference_type)in_stack_fffffffffffff480);
              local_8b8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11751e);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x11753b);
            }
            local_888 = bitmap::BitmapArray<long>::iterator::operator+
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_908 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1175c6);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1175e3)
            ;
            local_8f8 = bitmap::BitmapArray<long>::iterator::operator+
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            p1_05.pos_ = in_stack_fffffffffffff550;
            p1_05.array_ = in_stack_fffffffffffff548;
            p2_05.pos_ = in_stack_fffffffffffff540;
            p2_05.array_ = in_stack_fffffffffffff538;
            iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>
                              (in_stack_fffffffffffff530,p1_05,p2_05,in_stack_fffffffffffff528);
            bVar2 = iVar3 == 0;
          }
          if (bVar2) {
            local_918 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x117656);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x117673)
            ;
            local_928 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x117689);
            bitmap::BitmapArray<long>::value_reference::operator=
                      ((value_reference *)in_stack_fffffffffffff480,(long)in_stack_fffffffffffff478)
            ;
          }
          if ((local_74 & 2) != 0) {
            local_938 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1176cb);
            lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x1176e8);
            bVar2 = false;
            if (-1 < lVar5) {
              in_stack_fffffffffffff4c0 = local_38;
              local_968 = bitmap::BitmapArray<long>::iterator::operator-
                                    ((iterator *)in_stack_fffffffffffff488,
                                     (difference_type)in_stack_fffffffffffff480);
              local_958 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x117738);
              lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                ((value_reference *)0x117755);
              if (lVar5 < 0) {
                local_9a8 = bitmap::BitmapArray<long>::iterator::operator-
                                      ((iterator *)in_stack_fffffffffffff488,
                                       (difference_type)in_stack_fffffffffffff480);
                local_998 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1177e1);
                uVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                  ((value_reference *)0x1177fe);
                in_stack_fffffffffffff4b8 = (BitmapArray<long> *)(uVar7 ^ 0xffffffffffffffff);
              }
              else {
                local_988 = bitmap::BitmapArray<long>::iterator::operator-
                                      ((iterator *)in_stack_fffffffffffff488,
                                       (difference_type)in_stack_fffffffffffff480);
                local_978 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11778e);
                in_stack_fffffffffffff4b8 =
                     (BitmapArray<long> *)
                     bitmap::BitmapArray::value_reference::operator_cast_to_long
                               ((value_reference *)0x1177ab);
              }
              local_948 = bitmap::BitmapArray<long>::iterator::operator+
                                    ((iterator *)in_stack_fffffffffffff488,
                                     (difference_type)in_stack_fffffffffffff480);
              local_9c8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x117836);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x117853);
              local_9b8 = bitmap::BitmapArray<long>::iterator::operator+
                                    ((iterator *)in_stack_fffffffffffff488,
                                     (difference_type)in_stack_fffffffffffff480);
              p1_06.pos_ = in_stack_fffffffffffff550;
              p1_06.array_ = in_stack_fffffffffffff548;
              p2_06.pos_ = in_stack_fffffffffffff540;
              p2_06.array_ = in_stack_fffffffffffff538;
              iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>
                                (in_stack_fffffffffffff530,p1_06,p2_06,in_stack_fffffffffffff528);
              bVar2 = iVar3 == 0;
            }
            if (bVar2) {
              local_9d8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1178c6);
              in_stack_fffffffffffff4b0 =
                   bitmap::BitmapArray::value_reference::operator_cast_to_long
                             ((value_reference *)0x1178e3);
              in_stack_fffffffffffff4b0 = in_stack_fffffffffffff4b0 ^ 0xffffffffffffffff;
              local_9e8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1178f9);
              bitmap::BitmapArray<long>::value_reference::operator=
                        ((value_reference *)in_stack_fffffffffffff480,
                         (long)in_stack_fffffffffffff478);
            }
          }
          bVar2 = std::
                  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                  ::empty((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                           *)0x11792a);
          if (bVar2) {
            return;
          }
          pvVar6 = std::
                   stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                   ::top((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                          *)0x117942);
          memcpy(&local_a20,pvVar6,0x38);
          bitmap::BitmapArray<long>::iterator::operator=(&local_28,&local_a20);
          bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000008,&iStack_a10);
          bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000018,&iStack_a00);
          local_74 = local_9f0;
          std::
          stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
          ::pop((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                 *)0x1179b9);
        }
        else {
          local_618 = bitmap::BitmapArray<long>::iterator::operator-
                                ((iterator *)in_stack_fffffffffffff488,
                                 (difference_type)in_stack_fffffffffffff480);
          first1.pos_ = in_stack_fffffffffffff4c0;
          first1.array_ = in_stack_fffffffffffff4b8;
          last1.pos_ = in_stack_fffffffffffff4b0;
          last1.array_ = in_stack_fffffffffffff4a8;
          first2.pos_ = (pos_type)in_stack_fffffffffffff4a0;
          first2.array_ = (BitmapArray<long> *)in_stack_fffffffffffff498;
          helper::vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    (first1,last1,first2);
          it = bitmap::BitmapArray<long>::iterator::operator=
                         (&local_58,(iterator *)&stack0x00000008);
          bitmap::BitmapArray<long>::iterator::operator=(&local_48,it);
          local_78 = 0;
          local_648[0] = bitmap::BitmapArray<long>::iterator::operator+
                                   ((iterator *)in_stack_fffffffffffff488,
                                    (difference_type)in_stack_fffffffffffff480);
          bVar2 = bitmap::BitmapArray<long>::iterator::operator<
                            (local_648,(iterator *)&stack0x00000018);
          if (bVar2) {
            bitmap::BitmapArray<long>::iterator::operator+
                      ((iterator *)in_stack_fffffffffffff488,
                       (difference_type)in_stack_fffffffffffff480);
            bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116d3b);
            lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x116d58);
            if (lVar5 < 0) {
              while( true ) {
                bitmap::BitmapArray<long>::iterator::operator-
                          ((iterator *)in_stack_fffffffffffff488,
                           (difference_type)in_stack_fffffffffffff480);
                bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116d93);
                lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                  ((value_reference *)0x116db0);
                if (-1 < lVar5) break;
                bitmap::BitmapArray<long>::iterator::operator--(&local_48);
              }
              bitmap::BitmapArray<long>::iterator::operator+
                        ((iterator *)in_stack_fffffffffffff488,
                         (difference_type)in_stack_fffffffffffff480);
              bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116df9);
              in_stack_fffffffffffff528 =
                   bitmap::BitmapArray::value_reference::operator_cast_to_long
                             ((value_reference *)0x116e16);
              in_stack_fffffffffffff528 = in_stack_fffffffffffff528 ^ 0xffffffffffffffff;
              bitmap::BitmapArray<long>::iterator::operator+
                        ((iterator *)in_stack_fffffffffffff488,
                         (difference_type)in_stack_fffffffffffff480);
              bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116e54);
              bitmap::BitmapArray<long>::value_reference::operator=
                        ((value_reference *)in_stack_fffffffffffff480,
                         (long)in_stack_fffffffffffff478);
            }
            bitmap::BitmapArray<long>::iterator::operator=(&local_58,(iterator *)&stack0x00000008);
            while( true ) {
              bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116e9b);
              lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                ((value_reference *)0x116eb8);
              if (-1 < lVar5) break;
              bitmap::BitmapArray<long>::iterator::operator++(&local_58);
            }
            local_78 = 1;
          }
          dVar4 = bitmap::BitmapArray<long>::iterator::operator-(&local_48,&local_28);
          dVar9 = bitmap::BitmapArray<long>::iterator::operator-
                            ((iterator *)&stack0x00000018,&local_58);
          pVar1 = local_58.pos_;
          if (dVar9 < dVar4) {
            bVar2 = bitmap::BitmapArray<long>::iterator::operator==
                              (&local_48,(iterator *)&stack0x00000008);
            if ((bVar2) &&
               (bVar2 = bitmap::BitmapArray<long>::iterator::operator==
                                  ((iterator *)&stack0x00000008,&local_58), bVar2)) {
              local_78 = local_78 << 1;
            }
            local_788 = (value_type *)local_28.array_;
            local_780 = (BitmapArray<long> *)local_28.pos_;
            local_798 = bitmap::BitmapArray<long>::iterator::operator-
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_7a8 = (value_type *)local_48.array_;
            local_7a0 = (BitmapArray<long> *)local_48.pos_;
            a.pos_ = (pos_type)local_780;
            a.array_ = (BitmapArray<long> *)local_788;
            c.pos_ = local_48.pos_;
            c.array_ = local_48.array_;
            in_stack_fffffffffffff478 = (value_type *)local_48.array_;
            in_stack_fffffffffffff480 = (BitmapArray<long> *)local_48.pos_;
            helper::
            stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
            ::stackinfo4((stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
                          *)&stack0xfffffffffffff888,a,local_798,c,local_74 & 1 | local_78 & 2);
            std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
            ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)in_stack_fffffffffffff480,in_stack_fffffffffffff478);
            bitmap::BitmapArray<long>::iterator::operator=(&local_28,&local_58);
            bitmap::BitmapArray<long>::iterator::operator+=((iterator *)&stack0x00000008,local_60);
            local_74 = local_74 & 2 | local_78 & 1;
          }
          else {
            in_stack_fffffffffffff8e0 = local_58.array_;
            iVar11 = bitmap::BitmapArray<long>::iterator::operator+
                               ((iterator *)in_stack_fffffffffffff488,
                                (difference_type)in_stack_fffffffffffff480);
            in_stack_fffffffffffff8d0 = iVar11.array_;
            in_stack_fffffffffffff8d8 = (BitmapArray<long> *)iVar11.pos_;
            c_00.pos_ = (pos_type)in_stack_00000020;
            c_00.array_ = (BitmapArray<long> *)in_stack_00000018;
            a_00.pos_ = pVar1;
            a_00.array_ = in_stack_fffffffffffff8e0;
            in_stack_fffffffffffff478 = in_stack_00000018;
            in_stack_fffffffffffff480 = in_stack_00000020;
            in_stack_fffffffffffff8c0 = in_stack_00000018;
            in_stack_fffffffffffff8c8 = in_stack_00000020;
            helper::
            stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
            ::stackinfo4((stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
                          *)&stack0xfffffffffffff8f0,a_00,iVar11,c_00,local_74 & 2 | local_78 & 1);
            std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
            ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)in_stack_fffffffffffff480,in_stack_fffffffffffff478);
            bitmap::BitmapArray<long>::iterator::operator-=((iterator *)&stack0x00000008,local_60);
            bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000018,&local_48);
            local_74 = local_74 & 1;
          }
        }
      }
      else {
        bVar2 = bitmap::BitmapArray<long>::iterator::operator<
                          (&local_28,(iterator *)&stack0x00000008);
        if (bVar2) {
          PA_00.pos_ = (pos_type)in_stack_fffffffffffff8e0;
          PA_00.array_ = in_stack_fffffffffffff8d8;
          iVar11.pos_ = (pos_type)in_stack_fffffffffffff8d0;
          iVar11.array_ = in_stack_fffffffffffff8c8;
          in_stack_fffffffffffff478 = (value_type *)local_28.array_;
          in_stack_fffffffffffff480 = (BitmapArray<long> *)local_28.pos_;
          in_stack_fffffffffffff488 = in_stack_00000008;
          in_stack_fffffffffffff498 = in_stack_00000018;
          in_stack_fffffffffffff4a0 = in_stack_00000020;
          merge_forward<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    ((char *)in_stack_fffffffffffff8c0,PA_00,iVar11,in_stack_fffffffffffff8f0,
                     in_stack_fffffffffffff900,in_stack_fffffffffffff910,in_stack_fffffffffffff8b8);
        }
        if ((local_74 & 1) != 0) {
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116156);
          lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x116173);
          bVar2 = false;
          if (-1 < lVar5) {
            bitmap::BitmapArray<long>::iterator::operator-
                      ((iterator *)in_stack_fffffffffffff488,
                       (difference_type)in_stack_fffffffffffff480);
            bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1161c9);
            lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x1161e6);
            if (lVar5 < 0) {
              in_stack_fffffffffffffcb0 =
                   bitmap::BitmapArray<long>::iterator::operator-
                             ((iterator *)in_stack_fffffffffffff488,
                              (difference_type)in_stack_fffffffffffff480);
              bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116275);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x116292);
            }
            else {
              bitmap::BitmapArray<long>::iterator::operator-
                        ((iterator *)in_stack_fffffffffffff488,
                         (difference_type)in_stack_fffffffffffff480);
              bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11621f);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x11623c);
            }
            bitmap::BitmapArray<long>::iterator::operator+
                      ((iterator *)in_stack_fffffffffffff488,
                       (difference_type)in_stack_fffffffffffff480);
            in_stack_fffffffffffffc90 =
                 bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1162d0);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1162ed)
            ;
            in_stack_fffffffffffffca0 =
                 bitmap::BitmapArray<long>::iterator::operator+
                           ((iterator *)in_stack_fffffffffffff488,
                            (difference_type)in_stack_fffffffffffff480);
            p1_01.pos_ = in_stack_fffffffffffff550;
            p1_01.array_ = in_stack_fffffffffffff548;
            p2_01.pos_ = in_stack_fffffffffffff540;
            p2_01.array_ = in_stack_fffffffffffff538;
            iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>
                              (in_stack_fffffffffffff530,p1_01,p2_01,in_stack_fffffffffffff528);
            bVar2 = iVar3 == 0;
          }
          if (bVar2) {
            rVar10 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116369);
            in_stack_fffffffffffffc80 = rVar10.array_;
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x116386)
            ;
            rVar10 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11639f);
            in_stack_fffffffffffffc70 = rVar10.array_;
            in_stack_fffffffffffffc78 = (BitmapArray<long> *)rVar10.pos_;
            bitmap::BitmapArray<long>::value_reference::operator=
                      ((value_reference *)in_stack_fffffffffffff480,(long)in_stack_fffffffffffff478)
            ;
          }
        }
        if ((local_74 & 2) != 0) {
          rVar10 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1163e6);
          in_stack_fffffffffffffc60 = rVar10.array_;
          in_stack_fffffffffffffc68 = (BitmapArray<long> *)rVar10.pos_;
          lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x116403);
          bVar2 = false;
          if (-1 < lVar5) {
            local_3d0 = bitmap::BitmapArray<long>::iterator::operator-
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            local_3c0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116459);
            lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x116476);
            if (lVar5 < 0) {
              local_410 = bitmap::BitmapArray<long>::iterator::operator-
                                    ((iterator *)in_stack_fffffffffffff488,
                                     (difference_type)in_stack_fffffffffffff480);
              local_400 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116505);
              uVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                ((value_reference *)0x116522);
              in_stack_fffffffffffff550 = uVar7 ^ 0xffffffffffffffff;
            }
            else {
              local_3f0 = bitmap::BitmapArray<long>::iterator::operator-
                                    ((iterator *)in_stack_fffffffffffff488,
                                     (difference_type)in_stack_fffffffffffff480);
              local_3e0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1164af);
              in_stack_fffffffffffff550 =
                   bitmap::BitmapArray::value_reference::operator_cast_to_long
                             ((value_reference *)0x1164cc);
            }
            in_stack_fffffffffffffc50 =
                 bitmap::BitmapArray<long>::iterator::operator+
                           ((iterator *)in_stack_fffffffffffff488,
                            (difference_type)in_stack_fffffffffffff480);
            local_430 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x116560);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11657d)
            ;
            local_420 = bitmap::BitmapArray<long>::iterator::operator+
                                  ((iterator *)in_stack_fffffffffffff488,
                                   (difference_type)in_stack_fffffffffffff480);
            p1_02.pos_ = in_stack_fffffffffffff550;
            p1_02.array_ = in_stack_fffffffffffff548;
            p2_02.pos_ = in_stack_fffffffffffff540;
            p2_02.array_ = in_stack_fffffffffffff538;
            iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>
                              (in_stack_fffffffffffff530,p1_02,p2_02,in_stack_fffffffffffff528);
            bVar2 = iVar3 == 0;
          }
          if (bVar2) {
            local_440 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1165f9);
            uVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x116616);
            in_stack_fffffffffffff548 = (BitmapArray<long> *)(uVar7 ^ 0xffffffffffffffff);
            local_450 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11662f);
            bitmap::BitmapArray<long>::value_reference::operator=
                      ((value_reference *)in_stack_fffffffffffff480,(long)in_stack_fffffffffffff478)
            ;
          }
        }
        bVar2 = std::
                stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                ::empty((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                         *)0x116663);
        if (bVar2) {
          return;
        }
        pvVar6 = std::
                 stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                 ::top((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                        *)0x11667b);
        memcpy(&local_488,pvVar6,0x38);
        bitmap::BitmapArray<long>::iterator::operator=(&local_28,&local_488);
        bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000008,&iStack_478);
        bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000018,&iStack_468);
        local_74 = local_458;
        std::
        stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
        ::pop((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
               *)0x1166f2);
      }
    }
    bVar2 = bitmap::BitmapArray<long>::iterator::operator<(&local_28,(iterator *)&stack0x00000008);
    if ((bVar2) &&
       (bVar2 = bitmap::BitmapArray<long>::iterator::operator<
                          ((iterator *)&stack0x00000008,(iterator *)&stack0x00000018), bVar2)) {
      local_88 = local_18;
      local_80 = local_10;
      local_a8 = (value_type *)local_28.array_;
      local_a0 = (BitmapArray<long> *)local_28.pos_;
      PA_01.pos_ = (pos_type)in_stack_fffffffffffffc80;
      PA_01.array_ = in_stack_fffffffffffffc78;
      buf_00.pos_ = (pos_type)in_stack_fffffffffffffc70;
      buf_00.array_ = in_stack_fffffffffffffc68;
      in_stack_fffffffffffff478 = (value_type *)local_28.array_;
      in_stack_fffffffffffff480 = (BitmapArray<long> *)local_28.pos_;
      in_stack_fffffffffffff488 = in_stack_00000008;
      in_stack_fffffffffffff498 = in_stack_00000018;
      in_stack_fffffffffffff4a0 = in_stack_00000020;
      merge_backward<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                ((char *)in_stack_fffffffffffffc60,PA_01,buf_00,(iterator)in_stack_fffffffffffffc90,
                 in_stack_fffffffffffffca0,in_stack_fffffffffffffcb0,in_stack_fffffffffffffc50.pos_)
      ;
    }
    if ((local_74 & 1) != 0) {
      local_d8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115a38);
      lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x115a55);
      bVar2 = false;
      if (-1 < lVar5) {
        local_108 = bitmap::BitmapArray<long>::iterator::operator-
                              ((iterator *)in_stack_fffffffffffff488,
                               (difference_type)in_stack_fffffffffffff480);
        local_f8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115aab);
        lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x115ac8);
        if (lVar5 < 0) {
          local_148 = bitmap::BitmapArray<long>::iterator::operator-
                                ((iterator *)in_stack_fffffffffffff488,
                                 (difference_type)in_stack_fffffffffffff480);
          local_138 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115b57);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x115b74);
        }
        else {
          local_128 = bitmap::BitmapArray<long>::iterator::operator-
                                ((iterator *)in_stack_fffffffffffff488,
                                 (difference_type)in_stack_fffffffffffff480);
          local_118 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115b01);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x115b1e);
        }
        local_e8 = bitmap::BitmapArray<long>::iterator::operator+
                             ((iterator *)in_stack_fffffffffffff488,
                              (difference_type)in_stack_fffffffffffff480);
        local_168 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115bb2);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x115bcf);
        local_158 = bitmap::BitmapArray<long>::iterator::operator+
                              ((iterator *)in_stack_fffffffffffff488,
                               (difference_type)in_stack_fffffffffffff480);
        p1.pos_ = in_stack_fffffffffffff550;
        p1.array_ = in_stack_fffffffffffff548;
        p2.pos_ = in_stack_fffffffffffff540;
        p2.array_ = in_stack_fffffffffffff538;
        iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>
                          (in_stack_fffffffffffff530,p1,p2,in_stack_fffffffffffff528);
        bVar2 = iVar3 == 0;
      }
      if (bVar2) {
        local_178 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115c4b);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x115c68);
        local_188 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115c81);
        bitmap::BitmapArray<long>::value_reference::operator=
                  ((value_reference *)in_stack_fffffffffffff480,(long)in_stack_fffffffffffff478);
      }
    }
    if ((local_74 & 2) != 0) {
      local_198 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115cc8);
      lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x115ce5);
      bVar2 = false;
      if (-1 < lVar5) {
        local_1c8 = bitmap::BitmapArray<long>::iterator::operator-
                              ((iterator *)in_stack_fffffffffffff488,
                               (difference_type)in_stack_fffffffffffff480);
        local_1b8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115d3b);
        lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x115d58);
        if (lVar5 < 0) {
          local_208 = bitmap::BitmapArray<long>::iterator::operator-
                                ((iterator *)in_stack_fffffffffffff488,
                                 (difference_type)in_stack_fffffffffffff480);
          local_1f8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115de7);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x115e04);
        }
        else {
          local_1e8 = bitmap::BitmapArray<long>::iterator::operator-
                                ((iterator *)in_stack_fffffffffffff488,
                                 (difference_type)in_stack_fffffffffffff480);
          local_1d8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115d91);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x115dae);
        }
        local_1a8 = bitmap::BitmapArray<long>::iterator::operator+
                              ((iterator *)in_stack_fffffffffffff488,
                               (difference_type)in_stack_fffffffffffff480);
        local_228 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115e42);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x115e5f);
        local_218 = bitmap::BitmapArray<long>::iterator::operator+
                              ((iterator *)in_stack_fffffffffffff488,
                               (difference_type)in_stack_fffffffffffff480);
        p1_00.pos_ = in_stack_fffffffffffff550;
        p1_00.array_ = in_stack_fffffffffffff548;
        p2_00.pos_ = in_stack_fffffffffffff540;
        p2_00.array_ = in_stack_fffffffffffff538;
        iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>
                          (in_stack_fffffffffffff530,p1_00,p2_00,in_stack_fffffffffffff528);
        bVar2 = iVar3 == 0;
      }
      if (bVar2) {
        local_238 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115edb);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x115ef8);
        local_248 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115f11);
        bitmap::BitmapArray<long>::value_reference::operator=
                  ((value_reference *)in_stack_fffffffffffff480,(long)in_stack_fffffffffffff478);
      }
    }
    bVar2 = std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
            ::empty((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                     *)0x115f45);
    if (bVar2) break;
    pvVar6 = std::
             stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
             ::top((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)0x115f5d);
    memcpy(&local_280,pvVar6,0x38);
    bitmap::BitmapArray<long>::iterator::operator=(&local_28,&local_280);
    bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000008,&iStack_270);
    bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000018,&iStack_260);
    local_74 = local_250;
    std::
    stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
    ::pop((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
           *)0x115fd4);
  }
  return;
}

Assistant:

void merge(stack_type &stack, const StringIterator_type T,
           const SAIterator_type PA, SAIterator_type first,
           SAIterator_type middle, SAIterator_type last, BufIterator_type buf,
           typename std::iterator_traits<SAIterator_type>::value_type bufsize,
           typename std::iterator_traits<SAIterator_type>::value_type depth) {
  typedef typename std::iterator_traits<SAIterator_type>::difference_type difference_type;
  typedef typename stack_type::value_type stackinfo_type;
#define GETIDX(a) ((0 <= (a)) ? (a) : (~(a)))
#define MERGE_CHECK(a)\
  {\
    if((0 <= *(a)) &&\
       (compare(T, PA + GETIDX(*((a) - 1)), PA + *(a), depth) == 0)) {\
      *(a) = ~*(a);\
    }\
  }

  SAIterator_type i, j;
  difference_type m, len, half;
  int check, next;

  for (check = 0;;) {

    if ((last - middle) <= bufsize) {
      if ((first < middle) && (middle < last)) {
        merge_backward(T, PA, buf, first, middle, last, depth);
      }
      if (check & 1) {
        MERGE_CHECK(first);
      }
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
      continue;
    }

    if ((middle - first) <= bufsize) {
      if (first < middle) {
        merge_forward(T, PA, buf, first, middle, last, depth);
      }
      if (check & 1) {
        MERGE_CHECK(first);
      }
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
      continue;
    }

    for (m = 0, len = std::min(middle - first, last - middle), half = len >> 1;
        0 < len; len = half, half >>= 1) {
      if (compare(T, PA + GETIDX(*(middle + m + half)),
                  PA + GETIDX(*(middle - m - half - 1)), depth) < 0) {
        m += half + 1;
        half -= ((len & 1) == 0);
      }
    }

    if (0 < m) {
      helper::vecswap(middle - m, middle, middle);
      i = j = middle, next = 0;
      if ((middle + m) < last) {
        if (*(middle + m) < 0) {
          for (; *(i - 1) < 0; --i) {
          }
          *(middle + m) = ~*(middle + m);
        }
        for (j = middle; *j < 0; ++j) {
        }
        next = 1;
      }
      if ((i - first) <= (last - j)) {
        STACK_PUSH4(j, middle + m, last, (check & 2) | (next & 1));
        middle -= m, last = i, check = (check & 1);
      } else {
        if ((i == middle) && (middle == j)) {
          next <<= 1;
        }
        STACK_PUSH4(first, middle - m, i, (check & 1) | (next & 2));
        first = j, middle += m, check = (check & 2) | (next & 1);
      }
    } else {
      if (check & 1) {
        MERGE_CHECK(first);
      }
      MERGE_CHECK(middle);
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
    }
  }
#undef GETIDX
#undef MERGE_CHECK
}